

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

void __thiscall
kj::Maybe<capnp::compiler::CapnpParser::DeclParserResult>::Maybe
          (Maybe<capnp::compiler::CapnpParser::DeclParserResult> *this,
          Maybe<capnp::compiler::CapnpParser::DeclParserResult> *other)

{
  bool bVar1;
  CapTableBuilder *pCVar2;
  undefined8 uVar3;
  byte bVar4;
  
  bVar1 = (other->ptr).isSet;
  (this->ptr).isSet = bVar1;
  if (bVar1 == true) {
    pCVar2 = (other->ptr).field_1.value.decl.builder.capTable;
    (this->ptr).field_1.value.decl.builder.segment = (other->ptr).field_1.value.decl.builder.segment
    ;
    (this->ptr).field_1.value.decl.builder.capTable = pCVar2;
    (this->ptr).field_1.value.decl.builder.location =
         (other->ptr).field_1.value.decl.builder.location;
    (this->ptr).field_1.value.decl.builder.tag.content =
         (other->ptr).field_1.value.decl.builder.tag.content;
    (other->ptr).field_1.value.decl.builder.segment = (SegmentBuilder *)0x0;
    (other->ptr).field_1.value.decl.builder.location = (word *)0x0;
    bVar4 = (other->ptr).field_1.value.memberParser.ptr.isSet;
    (this->ptr).field_1.value.memberParser.ptr.isSet = (bool)bVar4;
    if ((bool)bVar4 == true) {
      uVar3 = *(undefined8 *)((long)&(other->ptr).field_1 + 0x30);
      *(undefined8 *)((long)&(this->ptr).field_1 + 0x28) =
           *(undefined8 *)((long)&(other->ptr).field_1 + 0x28);
      *(undefined8 *)((long)&(this->ptr).field_1 + 0x30) = uVar3;
      bVar4 = (other->ptr).field_1.value.memberParser.ptr.isSet;
    }
    if ((bVar4 & 1) != 0) {
      (other->ptr).field_1.value.memberParser.ptr.isSet = false;
    }
  }
  if (((other->ptr).isSet == true) &&
     ((other->ptr).isSet = false,
     (other->ptr).field_1.value.decl.builder.segment != (SegmentBuilder *)0x0)) {
    capnp::_::OrphanBuilder::euthanize((OrphanBuilder *)&(other->ptr).field_1.value);
  }
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }